

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O3

FT_ULong FT_Stream_TryRead(FT_Stream stream,FT_Byte *buffer,FT_ULong count)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = stream->pos;
  uVar2 = stream->size - uVar1;
  if (stream->size < uVar1 || uVar2 == 0) {
    count = 0;
  }
  else {
    if (stream->read == (FT_Stream_IoFunc)0x0) {
      if (uVar2 < count) {
        count = uVar2;
      }
      memcpy(buffer,stream->base + uVar1,count);
    }
    else {
      count = (*stream->read)(stream,uVar1,buffer,count);
    }
    stream->pos = stream->pos + count;
  }
  return count;
}

Assistant:

FT_BASE_DEF( FT_ULong )
  FT_Stream_TryRead( FT_Stream  stream,
                     FT_Byte*   buffer,
                     FT_ULong   count )
  {
    FT_ULong  read_bytes = 0;


    if ( stream->pos >= stream->size )
      goto Exit;

    if ( stream->read )
      read_bytes = stream->read( stream, stream->pos, buffer, count );
    else
    {
      read_bytes = stream->size - stream->pos;
      if ( read_bytes > count )
        read_bytes = count;

      FT_MEM_COPY( buffer, stream->base + stream->pos, read_bytes );
    }

    stream->pos += read_bytes;

  Exit:
    return read_bytes;
  }